

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_obj.c
# Opt level: O3

_Bool compare_obj_index(void *left,void *right)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar3[0] = -(*right == *left);
  auVar3[1] = -(*(char *)((long)right + 1) == *(char *)((long)left + 1));
  auVar3[2] = -(*(char *)((long)right + 2) == *(char *)((long)left + 2));
  auVar3[3] = -(*(char *)((long)right + 3) == *(char *)((long)left + 3));
  auVar3[4] = -(*(char *)((long)right + 4) == *(char *)((long)left + 4));
  auVar3[5] = -(*(char *)((long)right + 5) == *(char *)((long)left + 5));
  auVar3[6] = -(*(char *)((long)right + 6) == *(char *)((long)left + 6));
  auVar3[7] = -(*(char *)((long)right + 7) == *(char *)((long)left + 7));
  auVar3[8] = -(*(char *)((long)right + 8) == *(char *)((long)left + 8));
  auVar3[9] = -(*(char *)((long)right + 9) == *(char *)((long)left + 9));
  auVar3[10] = -(*(char *)((long)right + 10) == *(char *)((long)left + 10));
  auVar3[0xb] = -(*(char *)((long)right + 0xb) == *(char *)((long)left + 0xb));
  auVar3[0xc] = -(*(char *)((long)right + 0xc) == *(char *)((long)left + 0xc));
  auVar3[0xd] = -(*(char *)((long)right + 0xd) == *(char *)((long)left + 0xd));
  auVar3[0xe] = -(*(char *)((long)right + 0xe) == *(char *)((long)left + 0xe));
  auVar3[0xf] = -(*(char *)((long)right + 0xf) == *(char *)((long)left + 0xf));
  uVar1 = *(undefined8 *)((long)left + 0x10);
  uVar2 = *(undefined8 *)((long)right + 0x10);
  auVar4[0] = -((char)uVar2 == (char)uVar1);
  auVar4[1] = -((char)((ulong)uVar2 >> 8) == (char)((ulong)uVar1 >> 8));
  auVar4[2] = -((char)((ulong)uVar2 >> 0x10) == (char)((ulong)uVar1 >> 0x10));
  auVar4[3] = -((char)((ulong)uVar2 >> 0x18) == (char)((ulong)uVar1 >> 0x18));
  auVar4[4] = -((char)((ulong)uVar2 >> 0x20) == (char)((ulong)uVar1 >> 0x20));
  auVar4[5] = -((char)((ulong)uVar2 >> 0x28) == (char)((ulong)uVar1 >> 0x28));
  auVar4[6] = -((char)((ulong)uVar2 >> 0x30) == (char)((ulong)uVar1 >> 0x30));
  auVar4[7] = -((char)((ulong)uVar2 >> 0x38) == (char)((ulong)uVar1 >> 0x38));
  auVar4[8] = 0xff;
  auVar4[9] = 0xff;
  auVar4[10] = 0xff;
  auVar4[0xb] = 0xff;
  auVar4[0xc] = 0xff;
  auVar4[0xd] = 0xff;
  auVar4[0xe] = 0xff;
  auVar4[0xf] = 0xff;
  auVar4 = auVar4 & auVar3;
  return (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff;
}

Assistant:

static size_t compute_unique_vertices(
    const struct obj_model* model,
    struct hash_table* index_table,
    bool* has_normals, bool* has_tex_coords)
{
    // This maps unique triplets (v, t, n) to a unique vertex,
    // in order to match the way mesh indices work.
    for (size_t i = 0, n = model->index_count; i < n; ++i) {
        const struct obj_index* index = &model->indices[i];
        *has_normals |= index->n != 0;
        *has_tex_coords |= index->t != 0;
        size_t index_count = index_table->size;
        insert_in_hash_table(
            index_table,
            index, sizeof(struct obj_index),
            &index_count, sizeof(size_t),
            hash_obj_index(index),
            compare_obj_index);
    }
    return index_table->size;
}